

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O3

void Int32_To_Int8_Dither
               (void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
               uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  PaInt32 PVar1;
  PaInt32 *src;
  char *dest;
  
  if (count != 0) {
    do {
      PVar1 = PaUtil_Generate16BitTriangularDither(ditherGenerator);
      *(char *)destinationBuffer = (char)((*sourceBuffer >> 1) + PVar1 >> 0x17);
      destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride);
      sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride * 4);
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void Int32_To_Int8_Dither(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    PaInt32 *src = (PaInt32*)sourceBuffer;
    signed char *dest =  (signed char*)destinationBuffer;
    PaInt32 dither;

    while( count-- )
    {
        /* REVIEW */
        dither = PaUtil_Generate16BitTriangularDither( ditherGenerator );
        *dest = (signed char) ((((*src)>>1) + dither) >> 23);

        src += sourceStride;
        dest += destinationStride;
    }
}